

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O0

void bhdct_insert(planck_unit_test_t *tc,ion_dictionary_t *dict,ion_key_t key,ion_value_t value,
                 ion_boolean_t check_result)

{
  planck_unit_result_t pVar1;
  ion_status_t iVar2;
  char local_34;
  int32_t iStack_30;
  ion_status_t status;
  ion_boolean_t check_result_local;
  ion_value_t value_local;
  ion_key_t key_local;
  ion_dictionary_t *dict_local;
  planck_unit_test_t *tc_local;
  
  iVar2 = dictionary_insert(dict,key,value);
  local_34 = iVar2.error;
  pVar1 = planck_unit_assert_int_are_equal
                    (tc,0,(int)local_34,0xc6,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
                    );
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  iStack_30 = iVar2.count;
  pVar1 = planck_unit_assert_int_are_equal
                    (tc,1,iStack_30,199,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
                    );
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  if (check_result != '\0') {
    bhdct_get(tc,dict,key,value,'\0',1);
  }
  return;
}

Assistant:

void
bhdct_insert(
	planck_unit_test_t	*tc,
	ion_dictionary_t	*dict,
	ion_key_t			key,
	ion_value_t			value,
	ion_boolean_t		check_result
) {
	ion_status_t status = dictionary_insert(dict, key, value);

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 1, status.count);

	if (check_result) {
		bhdct_get(tc, dict, key, value, err_ok, 1);
	}
}